

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fixBoundingBox(Rtree *pRtree,RtreeNode *pNode)

{
  byte bVar1;
  byte bVar2;
  RtreeNode *pNode_00;
  RtreeNode *pNode_01;
  uint uVar3;
  int iVar4;
  uint iCell;
  RtreeNode *pParent;
  long in_FS_OFFSET;
  RtreeCell cell;
  RtreeCell box;
  RtreeCell local_98;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNode_00 = pNode->pParent;
  if (pNode_00 == (RtreeNode *)0x0) {
    iVar4 = 0;
  }
  else {
    pNode_01 = (RtreeNode *)pNode->zData;
    bVar1 = *(byte *)((long)&pNode_01->pParent + 2);
    bVar2 = *(byte *)((long)&pNode_01->pParent + 3);
    local_68.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
    local_68.aCoord[0].i = -1;
    local_68.aCoord[1].i = -1;
    local_68.aCoord[2].i = -1;
    local_68.aCoord[3].i = -1;
    local_68.aCoord[4].i = -1;
    local_68.aCoord[5].i = -1;
    local_68.aCoord[6].i = -1;
    local_68.aCoord[7].i = -1;
    local_68.aCoord[8] = (RtreeCoord)0xffffffff;
    local_68.aCoord[9] = (RtreeCoord)0xffffffff;
    nodeGetCell(pRtree,pNode_01,0,&local_68);
    uVar3 = 1;
    if (1 < (uint)bVar1 * 0x100 + (uint)bVar2) {
      uVar3 = (uint)CONCAT11(bVar1,bVar2);
      iCell = 1;
      do {
        local_98.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
        local_98.aCoord[4].i = -1;
        local_98.aCoord[5].i = -1;
        local_98.aCoord[6].i = -1;
        local_98.aCoord[7].i = -1;
        local_98.aCoord[0].i = -1;
        local_98.aCoord[1].i = -1;
        local_98.aCoord[2].i = -1;
        local_98.aCoord[3].i = -1;
        local_98.aCoord[8] = (RtreeCoord)0xffffffff;
        local_98.aCoord[9] = (RtreeCoord)0xffffffff;
        nodeGetCell(pRtree,pNode_01,iCell,&local_98);
        cellUnion(pRtree,&local_68,&local_98);
        iCell = iCell + 1;
      } while (CONCAT11(bVar1,bVar2) != iCell);
    }
    local_98.iRowid = CONCAT44(local_98.iRowid._4_4_,uVar3);
    local_68.iRowid = pNode->iNode;
    iVar4 = nodeRowidIndex(pRtree,(RtreeNode *)pNode_00->zData,local_68.iRowid,(int *)&local_98);
    if (iVar4 == 0) {
      nodeOverwriteCell(pRtree,pNode_00,&local_68,(int)local_98.iRowid);
      iVar4 = fixBoundingBox(pRtree,pNode_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fixBoundingBox(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode *pParent = pNode->pParent;
  int rc = SQLITE_OK;
  if( pParent ){
    int ii;
    int nCell = NCELL(pNode);
    RtreeCell box;                            /* Bounding box for pNode */
    nodeGetCell(pRtree, pNode, 0, &box);
    for(ii=1; ii<nCell; ii++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, ii, &cell);
      cellUnion(pRtree, &box, &cell);
    }
    box.iRowid = pNode->iNode;
    rc = nodeParentIndex(pRtree, pNode, &ii);
    if( rc==SQLITE_OK ){
      nodeOverwriteCell(pRtree, pParent, &box, ii);
      rc = fixBoundingBox(pRtree, pParent);
    }
  }
  return rc;
}